

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O2

int pk_use_ecparams(mbedtls_asn1_buf *params,mbedtls_ecp_group *grp)

{
  mbedtls_mpi *X;
  long lVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  mbedtls_ecp_group_id *pmVar5;
  size_t sVar6;
  mbedtls_ecp_group_id id;
  uchar *end;
  mbedtls_ecp_group_id grp_id;
  undefined4 uStack_244;
  int local_240;
  int local_23c;
  mbedtls_mpi *local_238;
  mbedtls_mpi *local_230;
  mbedtls_ecp_group *local_228;
  uchar *p;
  mbedtls_mpi local_218;
  mbedtls_mpi local_200;
  mbedtls_mpi local_1e8;
  mbedtls_mpi local_1d0;
  mbedtls_mpi local_1b8;
  mbedtls_mpi mStack_1a0;
  mbedtls_mpi mStack_188;
  size_t local_170;
  size_t local_168;
  undefined1 local_128 [176];
  size_t local_78;
  size_t local_70;
  
  if (params->tag == 6) {
    iVar3 = mbedtls_oid_get_ec_grp(params,&grp_id);
    iVar4 = -0x3a00;
    id = grp_id;
    goto joined_r0x0011115d;
  }
  mbedtls_ecp_group_init((mbedtls_ecp_group *)local_128);
  p = params->p;
  end = p + params->len;
  iVar3 = mbedtls_asn1_get_int(&p,end,&local_23c);
  if (iVar3 != 0) goto LAB_00110f87;
  if (local_23c - 4U < 0xfffffffd) {
LAB_001110e0:
    iVar4 = -0x3d00;
LAB_0011111d:
    id = (mbedtls_ecp_group_id)params;
  }
  else {
    iVar4 = mbedtls_asn1_get_tag(&p,end,(size_t *)&grp_id,0x30);
    if (iVar4 != 0) goto LAB_0011111d;
    params = (mbedtls_asn1_buf *)(p + CONCAT44(uStack_244,grp_id));
    iVar4 = mbedtls_asn1_get_tag(&p,(uchar *)params,(size_t *)&grp_id,6);
    puVar2 = p;
    if (((iVar4 != 0) || (iVar4 = -0x3980, CONCAT44(uStack_244,grp_id) != 7)) ||
       (iVar3 = bcmp(p,anon_var_dwarf_5787,7), iVar3 != 0)) goto LAB_0011111d;
    p = puVar2 + 7;
    X = (mbedtls_mpi *)(local_128 + 8);
    iVar3 = mbedtls_asn1_get_mpi(&p,(uchar *)params,X);
    if (iVar3 != 0) goto LAB_00110f87;
    local_78 = mbedtls_mpi_bitlen(X);
    iVar4 = -0x3d66;
    if (((mbedtls_asn1_buf *)p != params) ||
       (iVar4 = mbedtls_asn1_get_tag(&p,end,(size_t *)&grp_id,0x30), iVar4 != 0)) goto LAB_0011111d;
    params = (mbedtls_asn1_buf *)(p + CONCAT44(uStack_244,grp_id));
    iVar3 = mbedtls_asn1_get_tag(&p,(uchar *)params,(size_t *)&grp_id,4);
    if ((iVar3 == 0) &&
       (iVar3 = mbedtls_mpi_read_binary
                          ((mbedtls_mpi *)(local_128 + 0x20),p,CONCAT44(uStack_244,grp_id)),
       iVar3 == 0)) {
      p = p + CONCAT44(uStack_244,grp_id);
      iVar3 = mbedtls_asn1_get_tag(&p,(uchar *)params,(size_t *)&grp_id,4);
      if ((iVar3 != 0) ||
         (iVar3 = mbedtls_mpi_read_binary
                            ((mbedtls_mpi *)(local_128 + 0x38),p,CONCAT44(uStack_244,grp_id)),
         iVar3 != 0)) goto LAB_00110f87;
      p = p + CONCAT44(uStack_244,grp_id);
      iVar3 = mbedtls_asn1_get_tag(&p,(uchar *)params,(size_t *)&grp_id,3);
      if (iVar3 == 0) {
        p = p + CONCAT44(uStack_244,grp_id);
      }
      iVar4 = -0x3d66;
      if ((mbedtls_asn1_buf *)p != params) goto LAB_0011111d;
      iVar3 = mbedtls_asn1_get_tag(&p,end,(size_t *)&grp_id,4);
      if (iVar3 != 0) goto LAB_00110f87;
      params = (mbedtls_asn1_buf *)(local_128 + 0x50);
      iVar3 = mbedtls_ecp_point_read_binary
                        ((mbedtls_ecp_group *)local_128,(mbedtls_ecp_point *)params,p,
                         CONCAT44(uStack_244,grp_id));
      if (iVar3 != 0) {
        if ((((iVar3 != -0x4e80) || ((*p & 0xfe) != 2)) ||
            (lVar1 = CONCAT44(uStack_244,grp_id), sVar6 = mbedtls_mpi_size(X), lVar1 != sVar6 + 1))
           || ((iVar3 = mbedtls_mpi_read_binary
                                  ((mbedtls_mpi *)params,p + 1,CONCAT44(uStack_244,grp_id) - 1),
               iVar3 != 0 ||
               (iVar3 = mbedtls_mpi_lset((mbedtls_mpi *)(local_128 + 0x68),(ulong)*p - 2),
               iVar3 != 0)))) goto LAB_001110e0;
        iVar3 = mbedtls_mpi_lset((mbedtls_mpi *)(local_128 + 0x80),1);
        iVar4 = -0x3d00;
        if (iVar3 != 0) goto LAB_0011111d;
      }
      p = p + CONCAT44(uStack_244,grp_id);
      params = (mbedtls_asn1_buf *)(local_128 + 0x98);
      iVar3 = mbedtls_asn1_get_mpi(&p,end,(mbedtls_mpi *)params);
      if (iVar3 != 0) goto LAB_00110f87;
      local_70 = mbedtls_mpi_bitlen((mbedtls_mpi *)params);
LAB_00110f93:
      local_228 = grp;
      mbedtls_ecp_group_init((mbedtls_ecp_group *)&p);
      pmVar5 = mbedtls_ecp_grp_id_list();
      local_230 = (mbedtls_mpi *)(local_128 + 0x98);
      local_238 = (mbedtls_mpi *)(local_128 + 0x80);
      for (; *pmVar5 != MBEDTLS_ECP_DP_NONE; pmVar5 = pmVar5 + 1) {
        mbedtls_ecp_group_free((mbedtls_ecp_group *)&p);
        iVar3 = mbedtls_ecp_group_load((mbedtls_ecp_group *)&p,*pmVar5);
        if (iVar3 != 0) goto LAB_00111127;
        if ((((local_78 == local_170) && (local_70 == local_168)) &&
            ((iVar3 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)(local_128 + 8),&local_218), iVar3 == 0 &&
             (((iVar3 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)(local_128 + 0x20),&local_200),
               iVar3 == 0 &&
               (iVar3 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)(local_128 + 0x38),&local_1e8),
               iVar3 == 0)) && (iVar3 = mbedtls_mpi_cmp_mpi(local_230,&mStack_188), iVar3 == 0))))))
           && ((iVar3 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)(local_128 + 0x50),&local_1d0),
               iVar3 == 0 && (iVar3 = mbedtls_mpi_cmp_mpi(local_238,&mStack_1a0), iVar3 == 0)))) {
          iVar3 = 0;
          local_240 = mbedtls_mpi_get_bit((mbedtls_mpi *)(local_128 + 0x68),0);
          iVar4 = mbedtls_mpi_get_bit(&local_1b8,0);
          if (local_240 == iVar4) goto LAB_00111127;
        }
      }
      iVar3 = 0;
LAB_00111127:
      mbedtls_ecp_group_free((mbedtls_ecp_group *)&p);
      id = *pmVar5;
      iVar4 = 0;
      if (id == MBEDTLS_ECP_DP_NONE) {
        iVar4 = -0x4e80;
      }
      grp = local_228;
      grp_id = id;
      if (iVar3 != 0) {
        iVar4 = iVar3;
      }
    }
    else {
LAB_00110f87:
      id = (mbedtls_ecp_group_id)params;
      iVar4 = iVar3 + -0x3d00;
      if (iVar3 + -0x3d00 == 0) goto LAB_00110f93;
    }
  }
  mbedtls_ecp_group_free((mbedtls_ecp_group *)local_128);
  iVar3 = iVar4;
joined_r0x0011115d:
  if ((iVar3 == 0) && ((grp->id == MBEDTLS_ECP_DP_NONE || (iVar4 = -0x3d00, grp->id == id)))) {
    iVar4 = mbedtls_ecp_group_load(grp,id);
  }
  return iVar4;
}

Assistant:

static int pk_use_ecparams( const mbedtls_asn1_buf *params, mbedtls_ecp_group *grp )
{
    int ret;
    mbedtls_ecp_group_id grp_id;

    if( params->tag == MBEDTLS_ASN1_OID )
    {
        if( mbedtls_oid_get_ec_grp( params, &grp_id ) != 0 )
            return( MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE );
    }
    else
    {
#if defined(MBEDTLS_PK_PARSE_EC_EXTENDED)
        if( ( ret = pk_group_id_from_specified( params, &grp_id ) ) != 0 )
            return( ret );
#else
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
#endif
    }

    /*
     * grp may already be initilialized; if so, make sure IDs match
     */
    if( grp->id != MBEDTLS_ECP_DP_NONE && grp->id != grp_id )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );

    if( ( ret = mbedtls_ecp_group_load( grp, grp_id ) ) != 0 )
        return( ret );

    return( 0 );
}